

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_on_push_response_headers_received
              (nghttp2_session *session,nghttp2_frame *frame,nghttp2_stream *stream)

{
  int iVar1;
  char *reason;
  
  if (stream->state != NGHTTP2_STREAM_RESERVED) {
    __assert_fail("stream->state == NGHTTP2_STREAM_RESERVED",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x10f8,
                  "int nghttp2_session_on_push_response_headers_received(nghttp2_session *, nghttp2_frame *, nghttp2_stream *)"
                 );
  }
  if ((frame->hd).stream_id == 0) {
    reason = "push response HEADERS: stream_id == 0";
  }
  else if (session->server == '\0') {
    if (session->num_incoming_streams < (ulong)(session->local_settings).max_concurrent_streams) {
      if ((session->goaway_flags & 5) != 0) {
        return -0x67;
      }
      if (session->num_incoming_streams < (ulong)session->pending_local_max_concurrent_stream) {
        nghttp2_stream_promise_fulfilled(stream);
        if ((stream->stream_id == 0) ||
           ((session->server == '\0') != (bool)((byte)stream->stream_id & 1))) {
          session->num_incoming_reserved_streams = session->num_incoming_reserved_streams - 1;
        }
        session->num_incoming_streams = session->num_incoming_streams + 1;
        iVar1 = session_call_on_begin_headers(session,frame);
        return iVar1;
      }
      iVar1 = session_inflate_handle_invalid_stream(session,frame,(int)stream);
      return iVar1;
    }
    reason = "push response HEADERS: max concurrent streams exceeded";
  }
  else {
    reason = "HEADERS: no HEADERS allowed from client in reserved state";
  }
  iVar1 = session_inflate_handle_invalid_connection(session,frame,-0x1f9,reason);
  return iVar1;
}

Assistant:

int nghttp2_session_on_push_response_headers_received(nghttp2_session *session,
                                                      nghttp2_frame *frame,
                                                      nghttp2_stream *stream) {
  int rv = 0;
  assert(stream->state == NGHTTP2_STREAM_RESERVED);
  if (frame->hd.stream_id == 0) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO,
        "push response HEADERS: stream_id == 0");
  }

  if (session->server) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO,
        "HEADERS: no HEADERS allowed from client in reserved state");
  }

  if (session_is_incoming_concurrent_streams_max(session)) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO,
        "push response HEADERS: max concurrent streams exceeded");
  }

  if (!session_allow_incoming_new_stream(session)) {
    /* We don't accept new stream after GOAWAY was sent. */
    return NGHTTP2_ERR_IGN_HEADER_BLOCK;
  }

  if (session_is_incoming_concurrent_streams_pending_max(session)) {
    return session_inflate_handle_invalid_stream(session, frame,
                                                 NGHTTP2_ERR_REFUSED_STREAM);
  }

  nghttp2_stream_promise_fulfilled(stream);
  if (!nghttp2_session_is_my_stream_id(session, stream->stream_id)) {
    --session->num_incoming_reserved_streams;
  }
  ++session->num_incoming_streams;
  rv = session_call_on_begin_headers(session, frame);
  if (rv != 0) {
    return rv;
  }
  return 0;
}